

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O2

void write_c_symtab(Elf64_Sym *sym,char *strtab,Elf64_Addr so_addr,size_t sym_cnt,uint8_t header,
                   lj_wbuf *buf)

{
  ulong uVar1;
  ulong uVar2;
  
  for (uVar1 = 1; uVar1 < sym_cnt; uVar1 = (ulong)((int)uVar1 + 1)) {
    if ((sym[uVar1].st_info & 0xf) == 2) {
      uVar2 = (ulong)sym[uVar1].st_name;
      if (uVar2 != 0) {
        lj_wbuf_addbyte(buf,header);
        lj_wbuf_addu64(buf,sym[uVar1].st_value + so_addr);
        lj_wbuf_addstring(buf,strtab + uVar2);
      }
    }
  }
  return;
}

Assistant:

static void write_c_symtab(ElfW(Sym *) sym, char *strtab, ElfW(Addr) so_addr,
			   size_t sym_cnt, const uint8_t header,
			   struct lj_wbuf *buf)
{
  /*
  ** Index 0 in ELF symtab is used to represent undefined symbols. Hence, we
  ** can just start with index 1.
  **
  ** For more information, see:
  ** https://docs.oracle.com/cd/E23824_01/html/819-0690/chapter6-79797.html
  */

  ElfW(Word) sym_index;
  for (sym_index = 1; sym_index < sym_cnt; sym_index++) {
    /*
    ** ELF32_ST_TYPE and ELF64_ST_TYPE are the same, so we can use
    ** ELF32_ST_TYPE for both 64-bit and 32-bit ELFs.
    **
    ** For more, see https://github.com/torvalds/linux/blob/9137eda53752ef73148e42b0d7640a00f1bc96b1/include/uapi/linux/elf.h#L135
    */
    if (ELF32_ST_TYPE(sym[sym_index].st_info) == STT_FUNC &&
        sym[sym_index].st_name != 0) {
      char *sym_name = &strtab[sym[sym_index].st_name];
      lj_wbuf_addbyte(buf, header);
      lj_wbuf_addu64(buf, sym[sym_index].st_value + so_addr);
      lj_wbuf_addstring(buf, sym_name);
    }
  }
}